

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

int __thiscall
leveldb::InternalKeyComparator::Compare(InternalKeyComparator *this,Slice *akey,Slice *bkey)

{
  Comparator *pCVar1;
  uint uVar2;
  long in_FS_OFFSET;
  Slice local_48;
  Slice local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = this->user_comparator_;
  local_38 = ExtractUserKey(akey);
  local_48 = ExtractUserKey(bkey);
  uVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_38,&local_48);
  if (uVar2 == 0) {
    if (*(ulong *)(bkey->data_ + (bkey->size_ - 8)) < *(ulong *)(akey->data_ + (akey->size_ - 8))) {
      uVar2 = 0xffffffff;
    }
    else {
      uVar2 = (uint)(*(ulong *)(akey->data_ + (akey->size_ - 8)) <
                    *(ulong *)(bkey->data_ + (bkey->size_ - 8)));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

int InternalKeyComparator::Compare(const Slice& akey, const Slice& bkey) const {
  // Order by:
  //    increasing user key (according to user-supplied comparator)
  //    decreasing sequence number
  //    decreasing type (though sequence# should be enough to disambiguate)
  int r = user_comparator_->Compare(ExtractUserKey(akey), ExtractUserKey(bkey));
  if (r == 0) {
    const uint64_t anum = DecodeFixed64(akey.data() + akey.size() - 8);
    const uint64_t bnum = DecodeFixed64(bkey.data() + bkey.size() - 8);
    if (anum > bnum) {
      r = -1;
    } else if (anum < bnum) {
      r = +1;
    }
  }
  return r;
}